

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warped_motion.c
# Opt level: O2

void av1_highbd_warp_affine_c
               (int32_t *mat,uint16_t *ref,int width,int height,int stride,uint16_t *pred,int p_col,
               int p_row,int p_width,int p_height,int p_stride,int subsampling_x,int subsampling_y,
               int bd,ConvolveParams *conv_params,int16_t alpha,int16_t beta,int16_t gamma,
               int16_t delta)

{
  int iVar1;
  byte bVar2;
  byte bVar3;
  uint16_t uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  byte bVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  int iVar26;
  byte bVar27;
  int iVar28;
  int32_t tmp [120];
  
  iVar1 = conv_params->is_compound;
  bVar2 = (byte)conv_params->round_0;
  if (iVar1 == 0) {
    bVar27 = 0xe - bVar2;
    bVar11 = (byte)conv_params->round_1;
  }
  else {
    bVar27 = (byte)conv_params->round_1;
    bVar11 = bVar27;
  }
  bVar3 = (byte)bd;
  bVar10 = 0xe - (bVar11 + bVar2);
  bVar11 = (bVar3 + 0xe) - (bVar11 + bVar2);
  iVar18 = (1 << (bVar27 & 0x1f)) >> 1;
  iVar20 = p_row;
  while( true ) {
    iVar5 = (p_height + p_row) - iVar20;
    if (iVar5 == 0 || p_height + p_row < iVar20) break;
    lVar16 = (long)(iVar20 + 4 << ((byte)subsampling_y & 0x1f));
    iVar12 = iVar5 + -4;
    if (8 < iVar5) {
      iVar12 = 4;
    }
    iVar5 = p_col;
    while( true ) {
      iVar6 = (p_width + p_col) - iVar5;
      if (iVar6 == 0 || p_width + p_col < iVar5) break;
      lVar8 = (long)(iVar5 + 4 << ((byte)subsampling_x & 0x1f));
      lVar24 = (long)*mat + mat[3] * lVar16 + mat[2] * lVar8 >> ((byte)subsampling_x & 0x3f);
      lVar17 = (long)mat[1] + mat[5] * lVar16 + mat[4] * lVar8 >> ((byte)subsampling_y & 0x3f);
      for (lVar8 = -7; lVar8 != 8; lVar8 = lVar8 + 1) {
        lVar9 = (int)((ulong)lVar17 >> 0x10) + lVar8;
        iVar15 = (int)lVar9;
        iVar7 = height + -1;
        if (iVar15 < height + -1) {
          iVar7 = iVar15;
        }
        if (lVar9 < 0) {
          iVar7 = 0;
        }
        iVar25 = ((int)lVar8 + 4) * (int)beta +
                 (((uint)lVar24 & 0xfffc) + ((int)alpha + (int)beta) * -4 & 0xffffffc0);
        iVar15 = (int)((ulong)lVar24 >> 0x10) + -7;
        for (lVar9 = -4; lVar9 != 4; lVar9 = lVar9 + 1) {
          iVar26 = 1 << (bVar3 + 6 & 0x1f);
          for (lVar23 = 0; lVar23 != 8; lVar23 = lVar23 + 1) {
            iVar19 = iVar15 + (int)lVar23;
            if (width + -1 <= iVar19) {
              iVar19 = width + -1;
            }
            if (iVar15 + lVar23 < 0) {
              iVar19 = 0;
            }
            iVar26 = iVar26 + (int)*(short *)((long)(iVar25 + 0x200 >> 10) * 0x10 + 0x435e60 +
                                             lVar23 * 2) * (uint)ref[iVar19 + iVar7 * stride];
          }
          tmp[lVar8 * 8 + 0x3c + lVar9] = iVar26 + ((1 << (bVar2 & 0x1f)) >> 1) >> (bVar2 & 0x1f);
          iVar25 = iVar25 + alpha;
          iVar15 = iVar15 + 1;
        }
      }
      iVar7 = iVar6 + -4;
      if (8 < iVar6) {
        iVar7 = 4;
      }
      iVar6 = (iVar5 - p_col) + 4;
      iVar15 = 0;
      for (lVar8 = -4; lVar8 < iVar12; lVar8 = lVar8 + 1) {
        iVar26 = (iVar20 - p_row) + 4 + (int)lVar8;
        iVar19 = iVar26 * p_stride;
        iVar28 = ((int)lVar8 + 4) * (int)delta +
                 (((uint)lVar17 & 0xfffc) + ((int)delta + (int)gamma) * -4 & 0xffffffc0);
        iVar25 = iVar15;
        for (lVar24 = -4; lVar24 < iVar7; lVar24 = lVar24 + 1) {
          iVar21 = 1 << ((bVar3 + 0xe) - bVar2 & 0x1f);
          iVar13 = iVar25;
          for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
            iVar21 = iVar21 + (int)*(short *)((long)(iVar28 + 0x200 >> 10) * 0x10 + 0x435e60 +
                                             lVar9 * 2) * tmp[iVar13];
            iVar13 = iVar13 + 8;
          }
          if (iVar1 == 0) {
            uVar4 = clip_pixel_highbd((iVar21 + iVar18 >> (bVar27 & 0x1f)) +
                                      (-1 << (bVar3 & 0x1f)) + (-1 << (bVar3 - 1 & 0x1f)),bd);
            pred[iVar6 + iVar19 + (int)lVar24] = uVar4;
          }
          else {
            iVar13 = iVar6 + (int)lVar24;
            iVar22 = iVar21 + iVar18 >> (bVar27 & 0x1f);
            iVar21 = conv_params->dst_stride * iVar26 + iVar13;
            if (conv_params->do_average == 0) {
              conv_params->dst[iVar21] = (CONV_BUF_TYPE)iVar22;
            }
            else {
              uVar14 = (uint)conv_params->dst[iVar21];
              if (conv_params->use_dist_wtd_comp_avg == 0) {
                iVar21 = (int)(iVar22 + uVar14) >> 1;
              }
              else {
                iVar21 = (int)(iVar22 * conv_params->bck_offset + uVar14 * conv_params->fwd_offset)
                         >> 4;
              }
              uVar4 = clip_pixel_highbd(iVar21 + ((1 << (bVar10 & 0x1f)) >> 1) +
                                                 (-1 << (bVar11 - 1 & 0x1f)) +
                                                 (-1 << (bVar11 & 0x1f)) >> (bVar10 & 0x1f),bd);
              pred[iVar13 + iVar19] = uVar4;
            }
          }
          iVar28 = iVar28 + gamma;
          iVar25 = iVar25 + 1;
        }
        iVar15 = iVar15 + 8;
      }
      iVar5 = iVar5 + 8;
    }
    iVar20 = iVar20 + 8;
  }
  return;
}

Assistant:

void av1_highbd_warp_affine_c(const int32_t *mat, const uint16_t *ref,
                              int width, int height, int stride, uint16_t *pred,
                              int p_col, int p_row, int p_width, int p_height,
                              int p_stride, int subsampling_x,
                              int subsampling_y, int bd,
                              ConvolveParams *conv_params, int16_t alpha,
                              int16_t beta, int16_t gamma, int16_t delta) {
  int32_t tmp[15 * 8];
  const int reduce_bits_horiz = conv_params->round_0;
  const int reduce_bits_vert = conv_params->is_compound
                                   ? conv_params->round_1
                                   : 2 * FILTER_BITS - reduce_bits_horiz;
  const int max_bits_horiz = bd + FILTER_BITS + 1 - reduce_bits_horiz;
  const int offset_bits_horiz = bd + FILTER_BITS - 1;
  const int offset_bits_vert = bd + 2 * FILTER_BITS - reduce_bits_horiz;
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  (void)max_bits_horiz;
  assert(IMPLIES(conv_params->is_compound, conv_params->dst != NULL));

  // Check that, even with 12-bit input, the intermediate values will fit
  // into an unsigned 16-bit intermediate array.
  assert(bd + FILTER_BITS + 2 - conv_params->round_0 <= 16);

  for (int i = p_row; i < p_row + p_height; i += 8) {
    for (int j = p_col; j < p_col + p_width; j += 8) {
      // Calculate the center of this 8x8 block,
      // project to luma coordinates (if in a subsampled chroma plane),
      // apply the affine transformation,
      // then convert back to the original coordinates (if necessary)
      const int32_t src_x = (j + 4) << subsampling_x;
      const int32_t src_y = (i + 4) << subsampling_y;
      const int64_t dst_x =
          (int64_t)mat[2] * src_x + (int64_t)mat[3] * src_y + (int64_t)mat[0];
      const int64_t dst_y =
          (int64_t)mat[4] * src_x + (int64_t)mat[5] * src_y + (int64_t)mat[1];
      const int64_t x4 = dst_x >> subsampling_x;
      const int64_t y4 = dst_y >> subsampling_y;

      const int32_t ix4 = (int32_t)(x4 >> WARPEDMODEL_PREC_BITS);
      int32_t sx4 = x4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);
      const int32_t iy4 = (int32_t)(y4 >> WARPEDMODEL_PREC_BITS);
      int32_t sy4 = y4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);

      sx4 += alpha * (-4) + beta * (-4);
      sy4 += gamma * (-4) + delta * (-4);

      sx4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);
      sy4 &= ~((1 << WARP_PARAM_REDUCE_BITS) - 1);

      // Horizontal filter
      for (int k = -7; k < 8; ++k) {
        const int iy = clamp(iy4 + k, 0, height - 1);

        int sx = sx4 + beta * (k + 4);
        for (int l = -4; l < 4; ++l) {
          int ix = ix4 + l - 3;
          const int offs = ROUND_POWER_OF_TWO(sx, WARPEDDIFF_PREC_BITS) +
                           WARPEDPIXEL_PREC_SHIFTS;
          assert(offs >= 0 && offs <= WARPEDPIXEL_PREC_SHIFTS * 3);
          const WarpedFilterCoeff *coeffs = av1_warped_filter[offs];

          int32_t sum = 1 << offset_bits_horiz;
          for (int m = 0; m < 8; ++m) {
            const int sample_x = clamp(ix + m, 0, width - 1);
            sum += ref[iy * stride + sample_x] * coeffs[m];
          }
          sum = ROUND_POWER_OF_TWO(sum, reduce_bits_horiz);
          assert(0 <= sum && sum < (1 << max_bits_horiz));
          tmp[(k + 7) * 8 + (l + 4)] = sum;
          sx += alpha;
        }
      }

      // Vertical filter
      for (int k = -4; k < AOMMIN(4, p_row + p_height - i - 4); ++k) {
        int sy = sy4 + delta * (k + 4);
        for (int l = -4; l < AOMMIN(4, p_col + p_width - j - 4); ++l) {
          const int offs = ROUND_POWER_OF_TWO(sy, WARPEDDIFF_PREC_BITS) +
                           WARPEDPIXEL_PREC_SHIFTS;
          assert(offs >= 0 && offs <= WARPEDPIXEL_PREC_SHIFTS * 3);
          const WarpedFilterCoeff *coeffs = av1_warped_filter[offs];

          int32_t sum = 1 << offset_bits_vert;
          for (int m = 0; m < 8; ++m) {
            sum += tmp[(k + m + 4) * 8 + (l + 4)] * coeffs[m];
          }

          if (conv_params->is_compound) {
            CONV_BUF_TYPE *p =
                &conv_params
                     ->dst[(i - p_row + k + 4) * conv_params->dst_stride +
                           (j - p_col + l + 4)];
            sum = ROUND_POWER_OF_TWO(sum, reduce_bits_vert);
            if (conv_params->do_average) {
              uint16_t *dst16 =
                  &pred[(i - p_row + k + 4) * p_stride + (j - p_col + l + 4)];
              int32_t tmp32 = *p;
              if (conv_params->use_dist_wtd_comp_avg) {
                tmp32 = tmp32 * conv_params->fwd_offset +
                        sum * conv_params->bck_offset;
                tmp32 = tmp32 >> DIST_PRECISION_BITS;
              } else {
                tmp32 += sum;
                tmp32 = tmp32 >> 1;
              }
              tmp32 = tmp32 - (1 << (offset_bits - conv_params->round_1)) -
                      (1 << (offset_bits - conv_params->round_1 - 1));
              *dst16 =
                  clip_pixel_highbd(ROUND_POWER_OF_TWO(tmp32, round_bits), bd);
            } else {
              *p = sum;
            }
          } else {
            uint16_t *p =
                &pred[(i - p_row + k + 4) * p_stride + (j - p_col + l + 4)];
            sum = ROUND_POWER_OF_TWO(sum, reduce_bits_vert);
            assert(0 <= sum && sum < (1 << (bd + 2)));
            *p = clip_pixel_highbd(sum - (1 << (bd - 1)) - (1 << bd), bd);
          }
          sy += gamma;
        }
      }
    }
  }
}